

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

uchar * cppcms::b64url::decode(uchar *begin,uchar *end,uchar *target)

{
  size_t sVar1;
  uchar *in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  
  for (; 3 < (long)in_RSI - (long)in_RDI; in_RDI = in_RDI + 4) {
    anon_unknown.dwarf_eef4d::bdecode(in_RDI,in_RSI,(size_t)in_RDX);
    in_RDX = in_RDX + 3;
  }
  if (in_RSI != in_RDI) {
    sVar1 = anon_unknown.dwarf_eef4d::bdecode(in_RDI,in_RSI,(size_t)in_RDX);
    in_RDX = in_RDX + sVar1;
  }
  return in_RDX;
}

Assistant:

unsigned char *decode(unsigned char const *begin,unsigned char const *end,unsigned char *target)
{
	while(end - begin >=4) {
		bdecode(begin,target,4);
		begin+=4;
		target+=3;
	}
	if(end!=begin)
		target+=bdecode(begin,target,end-begin);
	return target;
}